

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O1

int __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferBlitCase::init
          (FramebufferBlitCase *this,EVP_PKEY_CTX *ctx)

{
  FramebufferP *this_00;
  glBindFramebufferFunc p_Var1;
  int iVar2;
  GLuint GVar3;
  int extraout_EAX;
  undefined4 extraout_var;
  Functions *gl;
  ObjectTraits *pOVar4;
  ObjectWrapper *this_01;
  NotSupportedError *this_02;
  Renderbuffer colorbuf;
  Vec4 clearColor;
  ObjectWrapper OStack_58;
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  local_40;
  GLfloat local_30 [4];
  undefined4 extraout_var_00;
  
  iVar2 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar2) + 0x20) == 0) {
    iVar2 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var_00,iVar2);
    pOVar4 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
    glu::ObjectWrapper::ObjectWrapper(&OStack_58,gl,pOVar4);
    local_30[0] = 1.0;
    local_30[1] = 0.5;
    local_30[2] = 0.125;
    local_30[3] = 1.0;
    this_01 = (ObjectWrapper *)operator_new(0x18);
    pOVar4 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
    glu::ObjectWrapper::ObjectWrapper(this_01,gl,pOVar4);
    local_40.m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)0x0;
    this_00 = &this->m_fbo;
    if (&((this->m_fbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
          .m_data.ptr)->super_ObjectWrapper != this_01) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::reset(&this_00->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             );
      (this_00->
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)this_01;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset(&local_40);
    (*gl->bindFramebuffer)
              (0x8ca9,(((this_00->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (*gl->bindRenderbuffer)(0x8d41,OStack_58.m_object);
    (*gl->renderbufferStorage)(0x8d41,0x8058,0x40,0x40);
    (*gl->framebufferRenderbuffer)(0x8ca9,0x8ce0,0x8d41,OStack_58.m_object);
    (*gl->clearBufferfv)(0x1800,0,local_30);
    p_Var1 = gl->bindFramebuffer;
    GVar3 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[6])();
    (*p_Var1)(0x8ca9,GVar3);
    glu::ObjectWrapper::~ObjectWrapper(&OStack_58);
    return extraout_EAX;
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_02,"Cannot blit to multisampled framebuffer",
             glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
             ,500);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FramebufferBlitCase::init (void)
{
	if (m_renderCtx.getRenderTarget().getNumSamples())
		throw tcu::NotSupportedError("Cannot blit to multisampled framebuffer", "", __FILE__, __LINE__);

	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	const glu::Renderbuffer	colorbuf	(gl);
	const tcu::Vec4			clearColor	(1.0f, 0.5, 0.125f, 1.0f);

	m_fbo = FramebufferP(new glu::Framebuffer(gl));

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, **m_fbo);

	gl.bindRenderbuffer(GL_RENDERBUFFER, *colorbuf);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, SIZE, SIZE);
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorbuf);

	gl.clearBufferfv(GL_COLOR, 0, clearColor.getPtr());
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_renderCtx.getDefaultFramebuffer());
}